

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_WriteArray(BCWriterState *s,JSValue obj)

{
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue obj_00;
  JSValue obj_01;
  int iVar1;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  undefined8 *in_RDI;
  JSValue JVar2;
  BOOL is_template;
  int ret;
  JSValue val;
  uint32_t len;
  uint32_t i;
  JSObject *p;
  JSAtom in_stack_000000bc;
  JSContext *in_stack_000000c0;
  undefined1 in_stack_000000c8 [16];
  undefined1 in_stack_000000d8 [16];
  BOOL in_stack_00000160;
  uint32_t in_stack_ffffffffffffff6c;
  uint8_t v_01;
  JSContext *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  uint32_t in_stack_ffffffffffffff7c;
  undefined4 uVar4;
  JSValueUnion in_stack_ffffffffffffff80;
  uint32_t *in_stack_ffffffffffffff88;
  int iVar5;
  undefined4 in_stack_ffffffffffffff94;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  uint local_58;
  uint local_54;
  BCWriterState *in_stack_ffffffffffffffd8;
  BCWriterState *s_00;
  JSValueUnion in_stack_ffffffffffffffe0;
  int64_t in_stack_ffffffffffffffe8;
  JSValueUnion local_10;
  
  v_01 = (uint8_t)(in_stack_ffffffffffffff6c >> 0x18);
  if (((*(int *)(in_RDI + 7) << 0x10) >> 0x18 == 0) || ((*(byte *)((long)in_RSI.ptr + 5) & 1) != 0))
  {
    bc_put_u8((BCWriterState *)in_stack_ffffffffffffff70,v_01);
    iVar5 = 0;
  }
  else {
    bc_put_u8((BCWriterState *)in_stack_ffffffffffffff70,v_01);
    iVar5 = 1;
  }
  JVar2.tag = in_stack_ffffffffffffffa0;
  JVar2.u.float64 = in_stack_ffffffffffffff98.float64;
  iVar1 = js_get_length32((JSContext *)CONCAT44(in_stack_ffffffffffffff94,iVar5),
                          in_stack_ffffffffffffff88,JVar2);
  if (iVar1 == 0) {
    bc_put_leb128((BCWriterState *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    for (local_54 = 0; local_54 < local_58; local_54 = local_54 + 1) {
      this_obj.tag._0_4_ = iVar5;
      this_obj.u.ptr = in_stack_ffffffffffffff88;
      this_obj.tag._4_4_ = in_stack_ffffffffffffff94;
      JVar2 = JS_GetPropertyUint32
                        ((JSContext *)in_stack_ffffffffffffff80.ptr,this_obj,
                         in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff80 = JVar2.u;
      in_stack_ffffffffffffff88 = (uint32_t *)JVar2.tag;
      iVar1 = JS_IsException(JVar2);
      if (iVar1 != 0) {
        return -1;
      }
      obj_00.tag = in_stack_ffffffffffffffe8;
      obj_00.u.float64 = in_stack_ffffffffffffffe0.float64;
      iVar1 = JS_WriteObjectRec(in_stack_ffffffffffffffd8,obj_00);
      v.u._4_4_ = in_stack_ffffffffffffff7c;
      v.u.int32 = in_stack_ffffffffffffff78;
      v.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
      JS_FreeValue(in_stack_ffffffffffffff70,v);
      if (iVar1 != 0) {
        return -1;
      }
      in_stack_ffffffffffffff94 = 0;
    }
    if (iVar5 == 0) {
      return 0;
    }
    s_00 = (BCWriterState *)*in_RDI;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_000000c0,(JSValue)in_stack_000000d8,in_stack_000000bc,
                       (JSValue)in_stack_000000c8,in_stack_00000160);
    local_10 = JVar2.u;
    uVar3 = (undefined4)JVar2.tag;
    uVar4 = JVar2.tag._4_4_;
    iVar5 = JS_IsException(JVar2);
    if (iVar5 == 0) {
      obj_01.tag = in_RDX;
      obj_01.u.ptr = in_RSI.ptr;
      iVar5 = JS_WriteObjectRec(s_00,obj_01);
      v_00.u._4_4_ = uVar4;
      v_00.u.int32 = uVar3;
      v_00.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
      JS_FreeValue((JSContext *)local_10.ptr,v_00);
      if (iVar5 == 0) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int JS_WriteArray(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    uint32_t i, len;
    JSValue val;
    int ret;
    BOOL is_template;
    
    if (s->allow_bytecode && !p->extensible) {
        /* not extensible array: we consider it is a
           template when we are saving bytecode */
        bc_put_u8(s, BC_TAG_TEMPLATE_OBJECT);
        is_template = TRUE;
    } else {
        bc_put_u8(s, BC_TAG_ARRAY);
        is_template = FALSE;
    }
    if (js_get_length32(s->ctx, &len, obj))
        goto fail1;
    bc_put_leb128(s, len);
    for(i = 0; i < len; i++) {
        val = JS_GetPropertyUint32(s->ctx, obj, i);
        if (JS_IsException(val))
            goto fail1;
        ret = JS_WriteObjectRec(s, val);
        JS_FreeValue(s->ctx, val);
        if (ret)
            goto fail1;
    }
    if (is_template) {
        val = JS_GetProperty(s->ctx, obj, JS_ATOM_raw);
        if (JS_IsException(val))
            goto fail1;
        ret = JS_WriteObjectRec(s, val);
        JS_FreeValue(s->ctx, val);
        if (ret)
            goto fail1;
    }
    return 0;
 fail1:
    return -1;
}